

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf1_sync_info(bcf1_t *line,kstring_t *str)

{
  uint8_t *puVar1;
  int iVar2;
  anon_union_4_2_947300a4_for_v1 aVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  anon_union_4_2_947300a4_for_v1 aVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  bcf_info_t *pbVar11;
  bcf_info_t *pbVar12;
  bool bVar13;
  bcf_info_t tmp;
  bcf_info_t *info;
  int irm;
  int i;
  kstring_t *str_local;
  bcf1_t *line_local;
  
  info._0_4_ = 0xffffffff;
  for (info._4_4_ = 0; (int)info._4_4_ < (int)((uint)*(undefined8 *)&line->field_0x10 & 0xffff);
      info._4_4_ = info._4_4_ + 1) {
    pbVar11 = (line->d).info;
    if (pbVar11[(int)info._4_4_].vptr == (uint8_t *)0x0) {
      if ((int)(uint)info < 0) {
        info._0_4_ = info._4_4_;
      }
    }
    else {
      kputsn_(pbVar11[(int)info._4_4_].vptr +
              -(long)(int)(*(uint *)&pbVar11[(int)info._4_4_].field_0x1c & 0x7fffffff),
              pbVar11[(int)info._4_4_].vptr_len +
              (*(uint *)&pbVar11[(int)info._4_4_].field_0x1c & 0x7fffffff),str);
      if (-1 < (int)(uint)info) {
        pbVar11 = (line->d).info + (int)(uint)info;
        iVar5 = pbVar11->key;
        iVar6 = pbVar11->type;
        iVar7 = pbVar11->len;
        aVar8 = pbVar11->v1;
        puVar1 = pbVar11->vptr;
        uVar9 = pbVar11->vptr_len;
        uVar10 = *(undefined4 *)&pbVar11->field_0x1c;
        pbVar11 = (line->d).info + (int)(uint)info;
        pbVar12 = (line->d).info + (int)info._4_4_;
        iVar2 = pbVar12->type;
        pbVar11->key = pbVar12->key;
        pbVar11->type = iVar2;
        aVar3 = pbVar12->v1;
        pbVar11->len = pbVar12->len;
        pbVar11->v1 = aVar3;
        pbVar11->vptr = pbVar12->vptr;
        uVar4 = *(undefined4 *)&pbVar12->field_0x1c;
        pbVar11->vptr_len = pbVar12->vptr_len;
        *(undefined4 *)&pbVar11->field_0x1c = uVar4;
        pbVar11 = (line->d).info + (int)info._4_4_;
        pbVar11->key = iVar5;
        pbVar11->type = iVar6;
        pbVar11->len = iVar7;
        pbVar11->v1 = aVar8;
        pbVar11->vptr = puVar1;
        pbVar11->vptr_len = uVar9;
        *(undefined4 *)&pbVar11->field_0x1c = uVar10;
        while( true ) {
          bVar13 = false;
          if ((int)(uint)info <= (int)info._4_4_) {
            bVar13 = (line->d).info[(int)(uint)info].vptr != (uint8_t *)0x0;
          }
          if (!bVar13) break;
          info._0_4_ = (uint)info + 1;
        }
      }
    }
  }
  if (-1 < (int)(uint)info) {
    *(ulong *)&line->field_0x10 =
         *(ulong *)&line->field_0x10 & 0xffffffffffff0000 | (ulong)(uint)info & 0xffff;
  }
  return;
}

Assistant:

static inline void bcf1_sync_info(bcf1_t *line, kstring_t *str)
{
    // pairs of typed vectors
    int i, irm = -1;
    for (i=0; i<line->n_info; i++)
    {
        bcf_info_t *info = &line->d.info[i];
        if ( !info->vptr )
        {
            // marked for removal
            if ( irm < 0 ) irm = i;
            continue;
        }
        kputsn_(info->vptr - info->vptr_off, info->vptr_len + info->vptr_off, str);
        if ( irm >=0 )
        {
            bcf_info_t tmp = line->d.info[irm]; line->d.info[irm] = line->d.info[i]; line->d.info[i] = tmp;
            while ( irm<=i && line->d.info[irm].vptr ) irm++;
        }
    }
    if ( irm>=0 ) line->n_info = irm;
}